

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.h
# Opt level: O0

string * __thiscall mocker::ScopeID::fmt_abi_cxx11_(string *__return_storage_ptr__,ScopeID *this)

{
  bool bVar1;
  reference puVar2;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  unsigned_long local_40;
  size_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  ScopeID *this_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->ids);
  id = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->ids);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&id), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    local_40 = *puVar2;
    std::__cxx11::to_string(&local_80,local_40);
    std::operator+(&local_60,&local_80,"-");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

std::string fmt() const {
    std::string res;
    for (std::size_t id : ids)
      res += std::to_string(id) + "-";
    res.pop_back();
    return res;
  }